

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_program __thiscall
CLIntercept::createProgramWithBuiltinKernels(CLIntercept *this,cl_context context)

{
  mapped_type *ppSVar1;
  cl_icd_dispatch *pcVar2;
  map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
  *in_RSI;
  CLIntercept *in_RDI;
  SBuiltinKernelOverrides *pOverrides;
  cl_program program;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  cl_program local_20;
  key_type *in_stack_ffffffffffffffe8;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_20 = (cl_program)0x0;
  ppSVar1 = std::
            map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
            ::operator[](in_RSI,in_stack_ffffffffffffffe8);
  if (*ppSVar1 != (mapped_type)0x0) {
    local_20 = (*ppSVar1)->Program;
    pcVar2 = dispatch(in_RDI);
    (*pcVar2->clRetainProgram)(local_20);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21eca3);
  return local_20;
}

Assistant:

cl_program CLIntercept::createProgramWithBuiltinKernels(
    cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    SBuiltinKernelOverrides*    pOverrides = m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        program = pOverrides->Program;
        dispatch().clRetainProgram( program );
    }

    return program;
}